

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

long duckdb::BinaryLambdaWrapper::
     Operation<duckdb::MismatchesFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
               (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
               idx_t idx)

{
  long lVar1;
  InvalidInputException *pIVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  string local_60;
  undefined8 local_40;
  long local_38;
  undefined8 local_30;
  long local_28;
  
  local_40 = left.value._8_8_;
  local_30 = fun.result;
  local_28 = left.value._0_8_;
  local_38 = right.value._0_8_;
  if ((uint)fun.result != left.value._8_4_) {
    pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Mismatch Function: Strings must be of equal length!","");
    InvalidInputException::InvalidInputException(pIVar2,&local_60);
    __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (((ulong)fun.result & 0xffffffff) != 0) {
    lVar5 = left.value._0_8_;
    if ((uint)fun.result < 0xd) {
      lVar5 = (long)&local_30 + 4;
    }
    lVar3 = right.value._0_8_;
    if (left.value._8_4_ < 0xd) {
      lVar3 = (long)&local_40 + 4;
    }
    uVar4 = 0;
    lVar1 = 0;
    do {
      lVar1 = lVar1 + (ulong)(*(char *)(lVar5 + uVar4) != *(char *)(lVar3 + uVar4));
      uVar4 = uVar4 + 1;
    } while (((ulong)fun.result & 0xffffffff) != uVar4);
    return lVar1;
  }
  pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Mismatch Function: Strings must be of length > 0!","");
  InvalidInputException::InvalidInputException(pIVar2,&local_60);
  __cxa_throw(pIVar2,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}